

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

bool __thiscall
glslang::HlslParseContext::handleOutputGeometry
          (HlslParseContext *this,TSourceLoc *loc,TLayoutGeometry *geometry)

{
  TLayoutGeometry TVar1;
  bool bVar2;
  char *pcVar3;
  TLayoutGeometry *geometry_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  
  if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangGeometry) {
    if ((this->parsingEntrypointParameters & 1U) == 0) {
      this_local._7_1_ = true;
    }
    else {
      TVar1 = *geometry;
      if (((TVar1 == ElgPoints) || (TVar1 == ElgLineStrip)) || (TVar1 == ElgTriangleStrip)) {
        bVar2 = TIntermediate::setOutputPrimitive
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                           *geometry);
        if (bVar2) {
          this_local._7_1_ = true;
        }
        else {
          pcVar3 = TQualifier::getGeometryString(*geometry);
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"output primitive geometry redefinition",pcVar3,"");
          this_local._7_1_ = false;
        }
      }
      else {
        pcVar3 = TQualifier::getGeometryString(*geometry);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"cannot apply to \'out\'",pcVar3,"");
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool HlslParseContext::handleOutputGeometry(const TSourceLoc& loc, const TLayoutGeometry& geometry)
{
    // If this is not a geometry shader, ignore.  It might be a mixed shader including several stages.
    // Since that's an OK situation, return true for success.
    if (language != EShLangGeometry)
        return true;

    // these can be declared on non-entry-points, in which case they lose their meaning
    if (! parsingEntrypointParameters)
        return true;

    switch (geometry) {
    case ElgPoints:
    case ElgLineStrip:
    case ElgTriangleStrip:
        if (! intermediate.setOutputPrimitive(geometry)) {
            error(loc, "output primitive geometry redefinition", TQualifier::getGeometryString(geometry), "");
            return false;
        }
        break;
    default:
        error(loc, "cannot apply to 'out'", TQualifier::getGeometryString(geometry), "");
        return false;
    }

    return true;
}